

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall
FIX::DataDictionary::checkIsInMessage(DataDictionary *this,FieldBase *field,MsgType *msgType)

{
  int field_00;
  TagNotDefinedForMessage *this_00;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = isMsgField(this,&(msgType->super_StringField).super_FieldBase.m_string,field->m_tag);
  if (bVar1) {
    return;
  }
  this_00 = (TagNotDefinedForMessage *)__cxa_allocate_exception(0x58);
  field_00 = field->m_tag;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  TagNotDefinedForMessage::TagNotDefinedForMessage(this_00,field_00,&local_40);
  __cxa_throw(this_00,&TagNotDefinedForMessage::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(TagNotDefinedForMessage) {
    if (!isMsgField(msgType, field.getTag())) {
      throw TagNotDefinedForMessage(field.getTag());
    }
  }